

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int backupOnePage(sqlite3_backup *p,Pgno iSrcPg,u8 *zSrcData,int bUpdate)

{
  u32 uVar1;
  u32 uVar2;
  BtShared *pBVar3;
  u32 uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  void *__dest;
  DbPage *pDestPg;
  DbPage *local_60;
  long local_58;
  int local_4c;
  Pager *local_48;
  size_t local_40;
  u8 *local_38;
  
  pBVar3 = p->pDest->pBt;
  local_48 = pBVar3->pPager;
  uVar1 = p->pSrc->pBt->pageSize;
  local_58 = (long)(int)uVar1;
  uVar2 = pBVar3->pageSize;
  lVar6 = (long)(int)uVar2;
  iVar5 = 0;
  uVar4 = uVar2;
  if ((int)uVar1 < (int)uVar2) {
    uVar4 = uVar1;
  }
  if (uVar1 != uVar2) {
    iVar5 = (uint)(local_48->tempFile != '\0') << 3;
  }
  if ((iVar5 == 0) && (0 < (int)uVar1)) {
    lVar8 = (ulong)iSrcPg * local_58;
    lVar9 = lVar8 - local_58;
    local_40 = (size_t)(int)uVar4;
    local_4c = bUpdate;
    local_38 = zSrcData;
    do {
      local_60 = (PgHdr *)0x0;
      iVar5 = 0;
      uVar7 = (uint)(lVar9 / lVar6);
      if ((uint)sqlite3PendingByte / p->pDest->pBt->pageSize != uVar7) {
        iVar5 = (*local_48->xGet)(local_48,uVar7 + 1,&local_60,0);
        if ((iVar5 == 0) && (iVar5 = sqlite3PagerWrite(local_60), iVar5 == 0)) {
          __dest = (void *)(lVar9 % lVar6 + (long)local_60->pData);
          memcpy(__dest,local_38 + lVar9 % local_58,local_40);
          iVar5 = 0;
          *(undefined1 *)local_60->pExtra = 0;
          if ((local_4c == 0) && (lVar9 == 0)) {
            uVar7 = p->pSrc->pBt->nPage;
            *(uint *)((long)__dest + 0x1c) =
                 uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
          }
        }
        if (local_60 != (DbPage *)0x0) {
          sqlite3PagerUnrefNotNull(local_60);
        }
      }
    } while ((iVar5 == 0) && (lVar9 = lVar9 + lVar6, lVar9 < lVar8));
  }
  return iVar5;
}

Assistant:

static int backupOnePage(
  sqlite3_backup *p,              /* Backup handle */
  Pgno iSrcPg,                    /* Source database page to backup */
  const u8 *zSrcData,             /* Source database page data */
  int bUpdate                     /* True for an update, false otherwise */
){
  Pager * const pDestPager = sqlite3BtreePager(p->pDest);
  const int nSrcPgsz = sqlite3BtreeGetPageSize(p->pSrc);
  int nDestPgsz = sqlite3BtreeGetPageSize(p->pDest);
  const int nCopy = MIN(nSrcPgsz, nDestPgsz);
  const i64 iEnd = (i64)iSrcPg*(i64)nSrcPgsz;
#ifdef SQLITE_HAS_CODEC
  /* Use BtreeGetReserveNoMutex() for the source b-tree, as although it is
  ** guaranteed that the shared-mutex is held by this thread, handle
  ** p->pSrc may not actually be the owner.  */
  int nSrcReserve = sqlite3BtreeGetReserveNoMutex(p->pSrc);
  int nDestReserve = sqlite3BtreeGetOptimalReserve(p->pDest);
#endif
  int rc = SQLITE_OK;
  i64 iOff;

  assert( sqlite3BtreeGetReserveNoMutex(p->pSrc)>=0 );
  assert( p->bDestLocked );
  assert( !isFatalError(p->rc) );
  assert( iSrcPg!=PENDING_BYTE_PAGE(p->pSrc->pBt) );
  assert( zSrcData );

  /* Catch the case where the destination is an in-memory database and the
  ** page sizes of the source and destination differ. 
  */
  if( nSrcPgsz!=nDestPgsz && sqlite3PagerIsMemdb(pDestPager) ){
    rc = SQLITE_READONLY;
  }

#ifdef SQLITE_HAS_CODEC
  /* Backup is not possible if the page size of the destination is changing
  ** and a codec is in use.
  */
  if( nSrcPgsz!=nDestPgsz && sqlite3PagerGetCodec(pDestPager)!=0 ){
    rc = SQLITE_READONLY;
  }

  /* Backup is not possible if the number of bytes of reserve space differ
  ** between source and destination.  If there is a difference, try to
  ** fix the destination to agree with the source.  If that is not possible,
  ** then the backup cannot proceed.
  */
  if( nSrcReserve!=nDestReserve ){
    u32 newPgsz = nSrcPgsz;
    rc = sqlite3PagerSetPagesize(pDestPager, &newPgsz, nSrcReserve);
    if( rc==SQLITE_OK && newPgsz!=nSrcPgsz ) rc = SQLITE_READONLY;
  }
#endif

  /* This loop runs once for each destination page spanned by the source 
  ** page. For each iteration, variable iOff is set to the byte offset
  ** of the destination page.
  */
  for(iOff=iEnd-(i64)nSrcPgsz; rc==SQLITE_OK && iOff<iEnd; iOff+=nDestPgsz){
    DbPage *pDestPg = 0;
    Pgno iDest = (Pgno)(iOff/nDestPgsz)+1;
    if( iDest==PENDING_BYTE_PAGE(p->pDest->pBt) ) continue;
    if( SQLITE_OK==(rc = sqlite3PagerGet(pDestPager, iDest, &pDestPg, 0))
     && SQLITE_OK==(rc = sqlite3PagerWrite(pDestPg))
    ){
      const u8 *zIn = &zSrcData[iOff%nSrcPgsz];
      u8 *zDestData = sqlite3PagerGetData(pDestPg);
      u8 *zOut = &zDestData[iOff%nDestPgsz];

      /* Copy the data from the source page into the destination page.
      ** Then clear the Btree layer MemPage.isInit flag. Both this module
      ** and the pager code use this trick (clearing the first byte
      ** of the page 'extra' space to invalidate the Btree layers
      ** cached parse of the page). MemPage.isInit is marked 
      ** "MUST BE FIRST" for this purpose.
      */
      memcpy(zOut, zIn, nCopy);
      ((u8 *)sqlite3PagerGetExtra(pDestPg))[0] = 0;
      if( iOff==0 && bUpdate==0 ){
        sqlite3Put4byte(&zOut[28], sqlite3BtreeLastPage(p->pSrc));
      }
    }
    sqlite3PagerUnref(pDestPg);
  }

  return rc;
}